

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FibHeap.h
# Opt level: O1

Node * __thiscall
FibHeap<std::pair<double,_int>_>::push
          (FibHeap<std::pair<double,_int>_> *this,pair<double,_int> *key)

{
  double dVar1;
  Node *pNVar2;
  Node *pNVar3;
  int iVar4;
  undefined4 uVar5;
  pointer pvVar6;
  Node **ppNVar7;
  
  pvVar6 = MemPool<FibHeap<std::pair<double,_int>_>::Node,_4096>::allocate(&this->alloc,1);
  iVar4 = key->second;
  uVar5 = *(undefined4 *)&key->field_0xc;
  (pvVar6->key).first = key->first;
  (pvVar6->key).second = iVar4;
  *(undefined4 *)&(pvVar6->key).field_0xc = uVar5;
  *(undefined8 *)((long)&pvVar6->head + 5) = 0;
  *(undefined8 *)((long)&pvVar6->tail + 5) = 0;
  pvVar6->p = (Node *)0x0;
  pvVar6->head = (Node *)0x0;
  pvVar6->next = (Node *)0x0;
  pvVar6->prev = (Node *)0x0;
  pNVar2 = this->root;
  pNVar2->degree = pNVar2->degree + 1;
  pNVar3 = pNVar2->head;
  ppNVar7 = &pNVar3->prev;
  if (pNVar3 == (Node *)0x0) {
    ppNVar7 = &pNVar2->tail;
  }
  *ppNVar7 = pvVar6;
  pvVar6->next = pNVar3;
  pNVar2->head = pvVar6;
  pvVar6->prev = (Node *)0x0;
  pNVar2 = this->min;
  if (pNVar2 != (Node *)0x0) {
    dVar1 = (pNVar2->key).first;
    if (dVar1 <= key->first) {
      if (dVar1 < key->first) {
        return pvVar6;
      }
      if ((pNVar2->key).second <= key->second) {
        return pvVar6;
      }
    }
  }
  this->min = pvVar6;
  return pvVar6;
}

Assistant:

Node *push(const K &key)
	{
		Node *x = alloc.newElem(key);
		root->push(x);
		if (!min || key < min->key)
			min = x;
		return x;
	}